

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[23],capnp::Text::Reader&,unsigned_int>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [23],
          Reader *params_1,uint *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  Reader *params_00;
  uint *params_01;
  long lVar4;
  ArrayPtr<kj::String> argValues_00;
  String argValues [3];
  String SStack_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[23]>(&SStack_78,(kj *)macroArgs,(char (*) [23])macroArgs);
  str<capnp::Text::Reader&>(&local_60,(kj *)params,params_00);
  str<unsigned_int&>(&local_48,(kj *)params_1,params_01);
  argValues_00.size_ = 3;
  argValues_00.ptr = &SStack_78;
  makeDescriptionInternal(__return_storage_ptr__,(char *)this,argValues_00);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&SStack_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&SStack_78.content.size_ + lVar4);
      *(undefined8 *)((long)&SStack_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&SStack_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&SStack_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}